

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_ReadWeightMap(char *pFileName,Abc_Nam_t *pNames)

{
  int iVar1;
  int Entry;
  char *__s;
  int Number;
  int NameId;
  char *pNum;
  char *pToken;
  char *pBuffer;
  Vec_Int_t *vWeights;
  Abc_Nam_t *pNames_local;
  char *pFileName_local;
  
  iVar1 = Abc_NamObjNumMax(pNames);
  pFileName_local = (char *)Vec_IntStartFull(iVar1);
  __s = Extra_FileReadContents(pFileName);
  if (__s == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    pNum = strtok(__s,"  \n\r(),");
    _Number = strtok((char *)0x0,"  \n\r(),");
    while (pNum != (char *)0x0) {
      iVar1 = Abc_NamStrFind(pNames,pNum);
      Entry = atoi(_Number);
      if (iVar1 < 1) {
        printf("Cannot find name \"%s\" among node names of this network.\n",pNum);
      }
      else {
        Vec_IntWriteEntry((Vec_Int_t *)pFileName_local,iVar1,Entry);
        pNum = strtok((char *)0x0,"  \n\r(),;");
        _Number = strtok((char *)0x0,"  \n\r(),;");
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Acb_ReadWeightMap( char * pFileName, Abc_Nam_t * pNames )
{
    Vec_Int_t * vWeights = Vec_IntStartFull( Abc_NamObjNumMax(pNames) );
    char * pBuffer = Extra_FileReadContents( pFileName );
    char * pToken, * pNum;
    if ( pBuffer == NULL )
        return NULL;
    pToken = strtok( pBuffer, "  \n\r()," );
    pNum   = strtok( NULL, "  \n\r()," );
    while ( pToken )
    {
        int NameId = Abc_NamStrFind(pNames, pToken);
        int Number = atoi(pNum);
        if ( NameId <= 0 )
        {
            printf( "Cannot find name \"%s\" among node names of this network.\n", pToken );
            continue;
        }
        Vec_IntWriteEntry( vWeights, NameId, Number );
        pToken = strtok( NULL, "  \n\r(),;" );
        pNum = strtok( NULL, "  \n\r(),;" );
    }
    ABC_FREE( pBuffer );
    return vWeights;
}